

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O1

void __thiscall BoundaryElement::upward_pass(BoundaryElement *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Timers_BoundaryElement *pTVar6;
  Elements *pEVar7;
  InterpolationPoints *pIVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  rep rVar12;
  long lVar13;
  ulong uVar14;
  int k2;
  pointer pdVar15;
  ulong uVar16;
  ulong uVar17;
  size_type sVar18;
  long lVar19;
  size_t node_idx;
  Tree *this_00;
  int k3;
  ulong uVar20;
  int iVar21;
  long lVar22;
  size_type __n;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  array<unsigned_long,_2UL> aVar35;
  vector<int,_std::allocator<int>_> exact_idx_x;
  vector<int,_std::allocator<int>_> exact_idx_z;
  vector<int,_std::allocator<int>_> exact_idx_y;
  vector<double,_std::allocator<double>_> weights;
  vector<double,_std::allocator<double>_> denominator;
  allocator_type local_1a1;
  unsigned_long local_1a0;
  pointer local_198;
  ulong local_190;
  long local_188;
  unsigned_long local_180;
  int local_174;
  pointer local_170;
  pointer local_168;
  pointer local_160;
  long local_158;
  pointer local_150;
  size_t local_148;
  pointer local_140;
  pointer local_138;
  vector<int,_std::allocator<int>_> local_130;
  pointer local_118;
  pointer local_110;
  pointer local_108;
  pointer local_100;
  BoundaryElement *local_f8;
  long local_f0;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  pointer local_c8;
  pointer local_c0;
  pointer local_b8;
  long local_b0;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  void *local_90 [2];
  long local_80;
  void *local_78 [2];
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  void *local_48 [2];
  long local_38;
  
  pTVar6 = this->timers_;
  rVar12 = std::chrono::_V2::steady_clock::now();
  (pTVar6->upward_pass).start_time_.__d.__r = rVar12;
  pEVar7 = this->elements_;
  pIVar8 = this->interp_pts_;
  local_160 = (pIVar8->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_168 = (pIVar8->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_170 = (pIVar8->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_b8 = (this->interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c0 = (this->interp_charge_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c8 = (this->interp_charge_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_d0 = (this->interp_charge_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  pdVar15 = (pEVar7->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_138 = (pEVar7->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_140 = (pEVar7->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_100 = (pEVar7->source_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_108 = (pEVar7->source_charge_dx_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_110 = (pEVar7->source_charge_dy_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_118 = (pEVar7->source_charge_dz_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)pIVar8->num_interp_pts_per_node_,(allocator_type *)&local_130);
  auVar10 = _DAT_0011a8d0;
  auVar9 = _DAT_0011a8c0;
  auVar28 = _DAT_0011a8b0;
  auVar29 = _DAT_0011a2a0;
  local_198 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  uVar11 = (uint)((ulong)((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                         (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar11) {
    lVar13 = (ulong)(uVar11 & 0x7fffffff) - 1;
    auVar24._8_4_ = (int)lVar13;
    auVar24._0_8_ = lVar13;
    auVar24._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar17 = 0;
    auVar24 = auVar24 ^ _DAT_0011a2a0;
    auVar26 = _DAT_0011a290;
    do {
      auVar31 = auVar26 ^ auVar29;
      auVar32._4_4_ = auVar26._0_4_;
      auVar32._0_4_ = auVar26._4_4_;
      auVar32._8_4_ = auVar26._12_4_;
      auVar32._12_4_ = auVar26._8_4_;
      auVar32 = auVar32 & auVar28;
      auVar33._0_4_ = -(uint)(auVar32._0_4_ == 0);
      auVar33._4_4_ = -(uint)(auVar32._4_4_ == 0);
      auVar33._8_4_ = -(uint)(auVar32._8_4_ == 0);
      auVar33._12_4_ = -(uint)(auVar32._12_4_ == 0);
      auVar32 = auVar33 & auVar10 | ~auVar33 & auVar9;
      dVar23 = auVar32._0_8_;
      dVar25 = auVar32._8_8_;
      if ((bool)(~(auVar31._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar31._0_4_ ||
                  auVar24._4_4_ < auVar31._4_4_) & 1)) {
        dVar34 = dVar23 * 0.5;
        dVar27 = dVar34;
        if (uVar11 - 1 != uVar17) {
          dVar27 = dVar23;
        }
        if (uVar17 != 0) {
          dVar34 = dVar27;
        }
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar17] = dVar34;
      }
      if ((auVar31._12_4_ != auVar24._12_4_ || auVar31._8_4_ <= auVar24._8_4_) &&
          auVar31._12_4_ <= auVar24._12_4_) {
        dVar23 = dVar25 * 0.5;
        if ((ulong)(uVar11 - 1) - 1 != uVar17) {
          dVar23 = dVar25;
        }
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar17 + 1] = dVar23;
      }
      uVar17 = uVar17 + 2;
      lVar13 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 2;
      auVar26._8_8_ = lVar13 + 2;
    } while ((uVar11 + 1 & 0xfffffffe) != uVar17);
  }
  this_00 = this->tree_;
  if (this_00->num_nodes_ != 0) {
    uVar11 = this->interp_pts_->num_interp_pts_per_node_;
    local_190 = (ulong)uVar11;
    local_174 = uVar11 * uVar11;
    local_158 = 0;
    node_idx = 0;
    local_150 = pdVar15;
    local_f8 = this;
    do {
      local_148 = node_idx;
      aVar35 = Tree::node_particle_idxs(this_00,node_idx);
      local_180 = aVar35._M_elems[1];
      local_1a0 = aVar35._M_elems[0];
      lVar13 = (long)this->interp_pts_->num_interp_pts_per_node_;
      local_188 = (long)this->num_charges_per_node_;
      __n = local_180 - local_1a0;
      std::vector<int,_std::allocator<int>_>::vector(&local_130,__n,(allocator_type *)local_78);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_78,__n,(allocator_type *)local_90);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_90,__n,(allocator_type *)local_48);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_48,__n,&local_1a1);
      if (local_180 != local_1a0) {
        sVar18 = 0;
        do {
          local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar18] = -1;
          *(undefined4 *)((long)local_78[0] + sVar18 * 4) = 0xffffffff;
          *(undefined4 *)((long)local_90[0] + sVar18 * 4) = 0xffffffff;
          sVar18 = sVar18 + 1;
        } while (__n != sVar18);
      }
      if (local_180 != local_1a0) {
        lVar19 = local_158 * lVar13;
        sVar18 = 0;
        do {
          if ((int)local_190 < 1) {
            dVar23 = 0.0;
            dVar25 = 0.0;
            dVar34 = 0.0;
          }
          else {
            lVar22 = local_1a0 + sVar18;
            dVar27 = local_140[lVar22];
            dVar1 = local_138[lVar22];
            dVar2 = pdVar15[lVar22];
            dVar23 = 0.0;
            dVar25 = 0.0;
            dVar34 = 0.0;
            uVar17 = 0;
            do {
              dVar30 = dVar2 - *(double *)((long)local_160 + uVar17 * 8 + lVar19);
              dVar3 = local_198[uVar17];
              dVar4 = *(double *)((long)local_170 + uVar17 * 8 + lVar19);
              dVar5 = *(double *)((long)local_168 + uVar17 * 8 + lVar19);
              iVar21 = (int)uVar17;
              if (ABS(dVar30) < 2.2250738585072014e-308) {
                local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[sVar18] = iVar21;
              }
              auVar29._0_8_ = dVar27 - dVar4;
              auVar29._8_8_ = dVar1 - dVar5;
              if (ABS(auVar29._8_8_) < 2.2250738585072014e-308) {
                *(int *)((long)local_78[0] + sVar18 * 4) = iVar21;
              }
              if (ABS(auVar29._0_8_) < 2.2250738585072014e-308) {
                *(int *)((long)local_90[0] + sVar18 * 4) = iVar21;
              }
              dVar34 = dVar34 + dVar3 / dVar30;
              auVar28._8_8_ = dVar3;
              auVar28._0_8_ = dVar3;
              auVar29 = divpd(auVar28,auVar29);
              dVar23 = dVar23 + auVar29._0_8_;
              dVar25 = dVar25 + auVar29._8_8_;
              uVar17 = uVar17 + 1;
            } while (local_190 != uVar17);
          }
          *(undefined8 *)((long)local_48[0] + sVar18 * 8) = 0x3ff0000000000000;
          if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[sVar18] == -1) {
            *(double *)((long)local_48[0] + sVar18 * 8) = 1.0 / dVar34;
          }
          if (*(int *)((long)local_78[0] + sVar18 * 4) == -1) {
            *(double *)((long)local_48[0] + sVar18 * 8) =
                 *(double *)((long)local_48[0] + sVar18 * 8) / dVar25;
          }
          if (*(int *)((long)local_90[0] + sVar18 * 4) == -1) {
            *(double *)((long)local_48[0] + sVar18 * 8) =
                 *(double *)((long)local_48[0] + sVar18 * 8) / dVar23;
          }
          sVar18 = sVar18 + 1;
        } while (sVar18 != __n);
      }
      if (0 < (int)local_190) {
        lVar13 = lVar13 * local_148;
        local_188 = local_188 * local_148;
        local_d8 = local_160 + lVar13;
        local_e0 = local_168 + lVar13;
        local_e8 = local_170 + lVar13;
        local_98 = local_140 + local_1a0;
        local_a0 = local_138 + local_1a0;
        local_a8 = local_150 + local_1a0;
        uVar17 = 0;
        do {
          local_f0 = local_174 * (int)uVar17 + local_188;
          uVar16 = 0;
          do {
            local_b0 = uVar16 * local_190 + local_f0;
            uVar20 = 0;
            do {
              dVar34 = 0.0;
              dVar27 = 0.0;
              dVar23 = 0.0;
              dVar25 = 0.0;
              if (local_180 != local_1a0) {
                sVar18 = 0;
                do {
                  if ((ulong)(uint)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[sVar18] == 0xffffffff) {
                    dVar1 = local_198[uVar17] / (local_a8[sVar18] - local_d8[uVar17]);
                  }
                  else {
                    dVar1 = 1.0;
                    if (uVar17 != (uint)local_130.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[sVar18]) {
                      dVar1 = 0.0;
                    }
                  }
                  uVar14 = (ulong)*(uint *)((long)local_78[0] + sVar18 * 4);
                  if (uVar14 == 0xffffffff) {
                    dVar1 = dVar1 * (local_198[uVar16] / (local_a0[sVar18] - local_e0[uVar16]));
                  }
                  else if (uVar16 != uVar14) {
                    dVar1 = dVar1 * 0.0;
                  }
                  uVar14 = (ulong)*(uint *)((long)local_90[0] + sVar18 * 4);
                  if (uVar14 == 0xffffffff) {
                    dVar1 = dVar1 * (local_198[uVar20] / (local_98[sVar18] - local_e8[uVar20]));
                  }
                  else if (uVar20 != uVar14) {
                    dVar1 = dVar1 * 0.0;
                  }
                  dVar2 = *(double *)((long)local_48[0] + sVar18 * 8);
                  dVar23 = dVar23 + local_110[local_1a0 + sVar18] * dVar1 * dVar2;
                  dVar25 = dVar25 + local_118[local_1a0 + sVar18] * dVar1 * dVar2;
                  dVar34 = dVar34 + dVar2 * local_100[local_1a0 + sVar18] * dVar1;
                  dVar27 = dVar27 + dVar2 * local_108[local_1a0 + sVar18] * dVar1;
                  sVar18 = sVar18 + 1;
                } while (__n != sVar18);
              }
              lVar13 = local_b0 + uVar20;
              local_b8[lVar13] = local_b8[lVar13] + dVar34;
              local_c0[lVar13] = dVar27 + local_c0[lVar13];
              local_c8[lVar13] = local_c8[lVar13] + dVar23;
              local_d0[lVar13] = dVar25 + local_d0[lVar13];
              uVar20 = uVar20 + 1;
            } while (uVar20 != local_190);
            uVar16 = uVar16 + 1;
          } while (uVar16 != local_190);
          uVar17 = uVar17 + 1;
        } while (uVar17 != local_190);
      }
      if (local_48[0] != (void *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      this = local_f8;
      pdVar15 = local_150;
      if (local_90[0] != (void *)0x0) {
        operator_delete(local_90[0],local_80 - (long)local_90[0]);
      }
      if (local_78[0] != (void *)0x0) {
        operator_delete(local_78[0],local_68 - (long)local_78[0]);
      }
      if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      node_idx = local_148 + 1;
      this_00 = this->tree_;
      local_158 = local_158 + 8;
    } while (node_idx < this_00->num_nodes_);
  }
  pTVar6 = this->timers_;
  lVar13 = std::chrono::_V2::steady_clock::now();
  (pTVar6->upward_pass).end_time_.__d.__r = lVar13;
  (pTVar6->upward_pass).elapsed_time_.__r =
       (double)(lVar13 - (pTVar6->upward_pass).start_time_.__d.__r) / 1000000.0 +
       (pTVar6->upward_pass).elapsed_time_.__r;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BoundaryElement::upward_pass()
{
    timers_.upward_pass.start();

    const double* __restrict clusters_x_ptr   = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr   = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr   = interp_pts_.interp_z_ptr();
    
    double* __restrict clusters_q_ptr         = interp_charge_.data();
    double* __restrict clusters_q_dx_ptr      = interp_charge_dx_.data();
    double* __restrict clusters_q_dy_ptr      = interp_charge_dy_.data();
    double* __restrict clusters_q_dz_ptr      = interp_charge_dz_.data();
    
    const double* __restrict elements_x_ptr  = elements_.x_ptr();
    const double* __restrict elements_y_ptr  = elements_.y_ptr();
    const double* __restrict elements_z_ptr  = elements_.z_ptr();
    
    const double* __restrict sources_q_ptr    = elements_.source_charge_ptr();
    const double* __restrict sources_q_dx_ptr = elements_.source_charge_dx_ptr();
    const double* __restrict sources_q_dy_ptr = elements_.source_charge_dy_ptr();
    const double* __restrict sources_q_dz_ptr = elements_.source_charge_dz_ptr();
        
    std::vector<double> weights (interp_pts_.num_interp_pts_per_node());
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }

    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    
#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = tree_.node_particle_idxs(node_idx);
        
        std::size_t node_interp_pts_start = node_idx * interp_pts_.num_interp_pts_per_node();
        std::size_t node_charges_start    = node_idx * num_charges_per_node_;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];
        
        std::vector<int> exact_idx_x(num_particles);
        std::vector<int> exact_idx_y(num_particles);
        std::vector<int> exact_idx_z(num_particles);
        std::vector<double> denominator(num_particles);
        
        int* exact_idx_x_ptr = exact_idx_x.data();
        int* exact_idx_y_ptr = exact_idx_y.data();
        int* exact_idx_z_ptr = exact_idx_z.data();
        double* denominator_ptr = denominator.data();
        
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc kernels present(elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                         sources_q_ptr, sources_q_dx_ptr, sources_q_dy_ptr, sources_q_dz_ptr, \
                         clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                         clusters_q_ptr, clusters_q_dx_ptr, clusters_q_dy_ptr, clusters_q_dz_ptr, \
                         weights_ptr) \
                  create(exact_idx_x_ptr[0:num_particles], exact_idx_y_ptr[0:num_particles], \
                         exact_idx_z_ptr[0:num_particles], denominator_ptr[0:num_particles])
#endif
        {

#ifdef OPENACC_ENABLED
        #pragma acc loop vector(32) independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
            exact_idx_x_ptr[i] = -1;
            exact_idx_y_ptr[i] = -1;
            exact_idx_z_ptr[i] = -1;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            double xx    = elements_x_ptr[particle_start + i];
            double yy    = elements_y_ptr[particle_start + i];
            double zz    = elements_z_ptr[particle_start + i];

            // because there's a reduction over exact_idx[i], this loop carries a
            // backward dependence and won't actually parallelize
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z)
#endif
            for (int j = 0; j < num_interp_pts_per_node; ++j) {
            
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x_ptr[i] = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y_ptr[i] = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z_ptr[i] = j;
            }
            
            denominator_ptr[i] = 1.0;
            if (exact_idx_x_ptr[i] == -1) denominator_ptr[i] /= denominator_x;
            if (exact_idx_y_ptr[i] == -1) denominator_ptr[i] /= denominator_y;
            if (exact_idx_z_ptr[i] == -1) denominator_ptr[i] /= denominator_z;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) independent
#endif
        for (int k1 = 0; k1 < num_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_interp_pts_per_node; ++k3) {
        
            std::size_t kk = node_charges_start
                   + k1 * num_interp_pts_per_node * num_interp_pts_per_node
                   + k2 * num_interp_pts_per_node + k3;
                   
            double cx = clusters_x_ptr[node_interp_pts_start + k1];
            double w1 = weights_ptr[k1];

            double cy = clusters_y_ptr[node_interp_pts_start + k2];
            double w2 = weights_ptr[k2];
            
            double cz = clusters_z_ptr[node_interp_pts_start + k3];
            double w3 = weights_ptr[k3];
            
            double q_temp    = 0.;
            double q_dx_temp = 0.;
            double q_dy_temp = 0.;
            double q_dz_temp = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:q_temp,q_dx_temp,q_dy_temp,q_dz_temp)
#endif
            for (std::size_t i = 0; i < num_particles; i++) {  // loop over source points
            
                double dist_x = elements_x_ptr[particle_start + i] - cx;
                double dist_y = elements_y_ptr[particle_start + i] - cy;
                double dist_z = elements_z_ptr[particle_start + i] - cz;
                
                double numerator = 1.;

                // If exact_idx[i] == -1, then no issues.
                // If exact_idx[i] != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x_ptr[i] == -1) {
                    numerator *= w1 / dist_x;
                } else {
                    if (exact_idx_x_ptr[i] != k1) numerator *= 0.;
                }

                if (exact_idx_y_ptr[i] == -1) {
                    numerator *= w2 / dist_y;
                } else {
                    if (exact_idx_y_ptr[i] != k2) numerator *= 0.;
                }

                if (exact_idx_z_ptr[i] == -1) {
                    numerator *= w3 / dist_z;
                } else {
                    if (exact_idx_z_ptr[i] != k3) numerator *= 0.;
                }

                q_temp    += sources_q_ptr   [particle_start + i] * numerator * denominator_ptr[i];
                q_dx_temp += sources_q_dx_ptr[particle_start + i] * numerator * denominator_ptr[i];
                q_dy_temp += sources_q_dy_ptr[particle_start + i] * numerator * denominator_ptr[i];
                q_dz_temp += sources_q_dz_ptr[particle_start + i] * numerator * denominator_ptr[i];
            }
            
            clusters_q_ptr   [kk] += q_temp;
            clusters_q_dx_ptr[kk] += q_dx_temp;
            clusters_q_dy_ptr[kk] += q_dy_temp;
            clusters_q_dz_ptr[kk] += q_dz_temp;
        }
        }
        }
        
        } // end parallel region
    } // end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

    timers_.upward_pass.stop();
}